

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::fastcgi::on_some_input_recieved
          (fastcgi *this,error_code *e,io_handler *h,pair<void_*,_unsigned_long> in)

{
  bool bVar1;
  undefined8 in_RCX;
  error_code *in_RDX;
  error_code *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  error_category *in_stack_ffffffffffffffd0;
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)in_RSI,in_RDX,
               (unsigned_long)in_stack_ffffffffffffffd0);
  }
  else if (((*(char *)((long)in_RDI + 0x131) == '\x05') &&
           ((uint)*(ushort *)((long)in_RDI + 0x132) == *(uint *)((long)in_RDI + 0x16c))) &&
          (*(short *)((long)in_RDI + 0x134) != 0)) {
    (**(code **)(*in_RDI + 0x88))(in_RDI,in_RCX,in_R8,in_RDX);
  }
  else {
    std::error_code::error_code
              ((error_code *)&stack0xffffffffffffffc8,1,(error_category *)&cppcms_category);
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)in_RSI,in_RDX,
               (unsigned_long)in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void on_some_input_recieved(booster::system::error_code const &e,io_handler const &h,std::pair<void *,size_t> in)
		{
			if(e) { h(e,0); return; }
			if(	header_.type!=fcgi_stdin 
				|| header_.request_id!=request_id_ 
				|| header_.content_length==0)
			{
				h(booster::system::error_code(errc::protocol_violation,cppcms_category),0);
				return;
			}
			async_read_some(in.first,in.second,h);
		}